

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O0

void __thiscall license::os::CpuInfo::CpuInfo(CpuInfo *this)

{
  CpuInfo *this_local;
  
  this->_vptr_CpuInfo = (_func_int **)&PTR__CpuInfo_001ff500;
  get_cpu_vendor_abi_cxx11_();
  get_cpu_brand_abi_cxx11_();
  return;
}

Assistant:

CpuInfo::CpuInfo() : m_vendor(get_cpu_vendor()), m_brand(get_cpu_brand()) {}